

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O3

void CmdCommandPrint(Abc_Frame_t *pAbc,int fPrintAll,int fDetails)

{
  st__table *table;
  int iVar1;
  int iVar2;
  Abc_Command **ppC1;
  st__generator *gen;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Abc_Command *pAVar10;
  FILE *__stream;
  char *pcVar11;
  uint uVar12;
  char *value;
  char *key;
  uint local_5c;
  Abc_Command *local_50;
  FILE *local_48;
  ulong local_40;
  char *local_38;
  
  table = pAbc->tCommands;
  local_48 = pAbc->Err;
  ppC1 = (Abc_Command **)malloc((long)table->num_entries << 3);
  gen = st__init_gen(table);
  iVar1 = st__gen(gen,&local_38,(char **)&local_50);
  if (iVar1 == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      if ((fPrintAll != 0) || (*local_50->sName != '_')) {
        lVar5 = (long)(int)uVar6;
        uVar6 = uVar6 + 1;
        ppC1[lVar5] = local_50;
      }
      iVar1 = st__gen(gen,&local_38,(char **)&local_50);
    } while (iVar1 != 0);
  }
  st__free_gen(gen);
  qsort(ppC1,(long)(int)uVar6,8,CmdCommandPrintCompare);
  iVar1 = CmdCommandPrintCompare(ppC1,ppC1 + ((long)(int)uVar6 - 1));
  if (0 < iVar1) {
    __assert_fail("CmdCommandPrintCompare( ppCommands, ppCommands + nCommands - 1 ) <= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cmd/cmdUtils.c"
                  ,0x245,"void CmdCommandPrint(Abc_Frame_t *, int, int)");
  }
  if ((int)uVar6 < 1) {
    uVar12 = 0;
  }
  else {
    uVar7 = 0;
    uVar8 = 0;
    do {
      sVar3 = strlen(ppC1[uVar7]->sName);
      uVar9 = sVar3 & 0xffffffff;
      if ((int)sVar3 < (int)uVar8) {
        uVar9 = uVar8;
      }
      uVar8 = uVar9;
      uVar7 = uVar7 + 1;
      uVar12 = (uint)uVar8;
    } while (uVar6 != uVar7);
  }
  local_40 = (ulong)uVar6;
  fprintf((FILE *)pAbc->Out,"      Welcome to ABC compiled on %s %s!","May  2 2025","21:44:03");
  pAbc->Err = pAbc->Out;
  if (0 < (int)uVar6) {
    uVar7 = 0;
    iVar1 = 0;
    pcVar11 = (char *)0x0;
    local_5c = 0;
    do {
      if (pcVar11 == (char *)0x0) {
        __stream = (FILE *)pAbc->Out;
LAB_003260ae:
        if ((fDetails != 0) && (uVar7 != local_5c)) {
          fputc(10,__stream);
          uVar8 = (ulong)(int)local_5c;
          if ((long)uVar8 < (long)uVar7) {
            do {
              uVar9 = uVar8 + 1;
              fputc(10,(FILE *)pAbc->Out);
              pcVar11 = ppC1[uVar8]->sName;
              sVar3 = strlen(pcVar11);
              pcVar4 = (char *)malloc(sVar3 + 4);
              sprintf(pcVar4,"%s -h",pcVar11);
              Cmd_CommandExecute(pAbc,pcVar4);
              if (pcVar4 != (char *)0x0) {
                free(pcVar4);
              }
              uVar8 = uVar9;
            } while ((uVar9 & 0xffffffff) != uVar7);
          }
          fputc(10,(FILE *)pAbc->Out);
          fwrite("   ----------------------------------------------------------------------",0x49,1,
                 (FILE *)pAbc->Out);
          __stream = (FILE *)pAbc->Out;
          local_5c = (uint)uVar7;
        }
        fputc(10,__stream);
        fputc(10,(FILE *)pAbc->Out);
        fprintf((FILE *)pAbc->Out,"%s commands:\n",ppC1[uVar7]->sGroup);
        fprintf((FILE *)pAbc->Out," %-*s",(ulong)uVar12,ppC1[uVar7]->sName);
        pcVar11 = ppC1[uVar7]->sGroup;
        iVar1 = 1;
      }
      else {
        pAVar10 = ppC1[uVar7];
        iVar2 = strcmp(pcVar11,pAVar10->sGroup);
        __stream = (FILE *)pAbc->Out;
        if (iVar2 != 0) goto LAB_003260ae;
        if (iVar1 % (int)(0x4f / (ulong)(uVar12 + 2)) == 0) {
          fputc(10,__stream);
          __stream = (FILE *)pAbc->Out;
          pAVar10 = ppC1[uVar7];
        }
        iVar1 = iVar1 + 1;
        fprintf(__stream," %-*s",(ulong)uVar12,pAVar10->sName);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_40);
    if ((fDetails != 0) && (uVar6 != local_5c)) {
      fputc(10,(FILE *)pAbc->Out);
      if ((int)local_5c < (int)uVar6) {
        lVar5 = 0;
        do {
          fputc(10,(FILE *)pAbc->Out);
          pcVar11 = ppC1[(int)local_5c + lVar5]->sName;
          sVar3 = strlen(pcVar11);
          pcVar4 = (char *)malloc(sVar3 + 4);
          sprintf(pcVar4,"%s -h",pcVar11);
          Cmd_CommandExecute(pAbc,pcVar4);
          if (pcVar4 != (char *)0x0) {
            free(pcVar4);
          }
          lVar5 = lVar5 + 1;
        } while (uVar6 - local_5c != (int)lVar5);
      }
    }
  }
  pAbc->Err = local_48;
  fputc(10,(FILE *)pAbc->Out);
  if (ppC1 != (Abc_Command **)0x0) {
    free(ppC1);
  }
  return;
}

Assistant:

void CmdCommandPrint( Abc_Frame_t * pAbc, int fPrintAll, int fDetails )
{
    const char *key;
    char *value;
    st__generator * gen;
    Abc_Command ** ppCommands;
    Abc_Command * pCommands;
    int nCommands, iGroupStart, i, j;
    char * sGroupCur;
    int LenghtMax, nColumns, iCom = 0;
    FILE *backupErr = pAbc->Err;

    // put all commands into one array
    nCommands = st__count( pAbc->tCommands );
    ppCommands = ABC_ALLOC( Abc_Command *, nCommands );
    i = 0;
    st__foreach_item( pAbc->tCommands, gen, &key, &value )
    {
        pCommands = (Abc_Command *)value;
        if ( fPrintAll || pCommands->sName[0] != '_' )
            ppCommands[i++] = pCommands;
    }
    nCommands = i;

    // sort command by group and then by name, alphabetically
    qsort( (void *)ppCommands, (size_t)nCommands, sizeof(Abc_Command *), 
            (int (*)(const void *, const void *)) CmdCommandPrintCompare );
    assert( CmdCommandPrintCompare( ppCommands, ppCommands + nCommands - 1 ) <= 0 );

    // get the longest command name
    LenghtMax = 0;
    for ( i = 0; i < nCommands; i++ )
        if ( LenghtMax < (int)strlen(ppCommands[i]->sName) )
             LenghtMax = (int)strlen(ppCommands[i]->sName); 
    // get the number of columns
    nColumns = 79 / (LenghtMax + 2);

    // print the starting message 
    fprintf( pAbc->Out, "      Welcome to ABC compiled on %s %s!", __DATE__, __TIME__ );

    // print the command by group
    sGroupCur = NULL;
    iGroupStart = 0;
    pAbc->Err = pAbc->Out;
    for ( i = 0; i < nCommands; i++ )
        if ( sGroupCur && strcmp( sGroupCur, ppCommands[i]->sGroup ) == 0 )
        { // this command belongs to the same group as the previous one
            if ( iCom++ % nColumns == 0 )
                fprintf( pAbc->Out, "\n" ); 
            // print this command
            fprintf( pAbc->Out, " %-*s", LenghtMax, ppCommands[i]->sName );
        }
        else
        { // this command starts the new group of commands
            // start the new group
            if ( fDetails && i != iGroupStart )
            { // print help messages for all commands in the previous groups
                fprintf( pAbc->Out, "\n" );
                for ( j = iGroupStart; j < i; j++ )
                {
                    char *tmp_cmd;
                    fprintf( pAbc->Out, "\n" );
                    // fprintf( pAbc->Out, "--- %s ---\n", ppCommands[j]->sName );
                    tmp_cmd = ABC_ALLOC(char, strlen(ppCommands[j]->sName)+4);
                    (void) sprintf(tmp_cmd, "%s -h", ppCommands[j]->sName);
                    (void) Cmd_CommandExecute( pAbc, tmp_cmd );
                    ABC_FREE(tmp_cmd);
                }
                fprintf( pAbc->Out, "\n" );
                fprintf( pAbc->Out, "   ----------------------------------------------------------------------" );
                iGroupStart = i;
            }
            fprintf( pAbc->Out, "\n" );
            fprintf( pAbc->Out, "\n" );
            fprintf( pAbc->Out, "%s commands:\n", ppCommands[i]->sGroup );
            // print this command
            fprintf( pAbc->Out, " %-*s", LenghtMax, ppCommands[i]->sName );
            // remember current command group
            sGroupCur = ppCommands[i]->sGroup;
            // reset the command counter
            iCom = 1;
        }
    if ( fDetails && i != iGroupStart )
    { // print help messages for all commands in the previous groups
        fprintf( pAbc->Out, "\n" );
        for ( j = iGroupStart; j < i; j++ )
        {
            char *tmp_cmd;
            fprintf( pAbc->Out, "\n" );
            // fprintf( pAbc->Out, "--- %s ---\n", ppCommands[j]->sName );
            tmp_cmd = ABC_ALLOC(char, strlen(ppCommands[j]->sName)+4);
            (void) sprintf(tmp_cmd, "%s -h", ppCommands[j]->sName);
            (void) Cmd_CommandExecute( pAbc, tmp_cmd );
            ABC_FREE(tmp_cmd);
        }
    }
    pAbc->Err = backupErr;
    fprintf( pAbc->Out, "\n" );
    ABC_FREE( ppCommands );
}